

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char32_t *
fmt::v8::detail::format_uint<4u,char32_t,unsigned_long>
          (char32_t *buffer,unsigned_long value,int num_digits,bool upper)

{
  bool bVar1;
  undefined7 in_register_00000009;
  char32_t *pcVar2;
  char *pcVar3;
  
  pcVar3 = "0123456789abcdef";
  if ((int)CONCAT71(in_register_00000009,upper) != 0) {
    pcVar3 = "0123456789ABCDEF";
  }
  pcVar2 = buffer + num_digits;
  do {
    pcVar2 = pcVar2 + -1;
    *pcVar2 = (int)pcVar3[(uint)value & 0xf];
    bVar1 = 0xf < value;
    value = value >> 4;
  } while (bVar1);
  return buffer + num_digits;
}

Assistant:

FMT_CONSTEXPR auto format_uint(Char* buffer, UInt value, int num_digits,
                               bool upper = false) -> Char* {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}